

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O3

void absl::time_internal::cctz::time_zone::Impl::ClearTimeZoneMapTestOnly(void)

{
  _Hash_node_base *p_Var1;
  deque<absl::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::time_internal::cctz::time_zone::Impl_const*>>
  *this;
  int iVar2;
  pthread_mutex_t *__mutex;
  _Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
  *this_00;
  
  __mutex = (pthread_mutex_t *)anon_unknown_7::TimeZoneMutex();
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    if ((anonymous_namespace)::time_zone_map_abi_cxx11_ ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) goto LAB_001529f7;
    if (ClearTimeZoneMapTestOnly()::cleared == '\0') goto LAB_00152a0b;
  }
  else {
    std::__throw_system_error(iVar2);
LAB_00152a0b:
    iVar2 = __cxa_guard_acquire(&ClearTimeZoneMapTestOnly()::cleared);
    if (iVar2 != 0) {
      this_00 = (_Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
                 *)operator_new(0x50);
      (this_00->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (this_00->_M_impl).super__Deque_impl_data._M_map_size = 0;
      std::
      _Deque_base<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
      ::_M_initialize_map(this_00,0);
      ClearTimeZoneMapTestOnly::cleared =
           (deque<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
            *)this_00;
      __cxa_guard_release(&ClearTimeZoneMapTestOnly()::cleared);
    }
  }
  this = (deque<absl::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::time_internal::cctz::time_zone::Impl_const*>>
          *)ClearTimeZoneMapTestOnly::cleared;
  for (p_Var1 = ((anonymous_namespace)::time_zone_map_abi_cxx11_->_M_before_begin)._M_nxt;
      ClearTimeZoneMapTestOnly::cleared =
           (deque<const_absl::time_internal::cctz::time_zone::Impl_*,_std::allocator<const_absl::time_internal::cctz::time_zone::Impl_*>_>
            *)this, p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    if (*(undefined8 **)(this + 0x30) == (undefined8 *)(*(long *)(this + 0x40) + -8)) {
      std::
      deque<absl::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::time_internal::cctz::time_zone::Impl_const*>>
      ::_M_push_back_aux<absl::time_internal::cctz::time_zone::Impl_const*const&>
                (this,(Impl **)(p_Var1 + 5));
    }
    else {
      **(undefined8 **)(this + 0x30) = (Impl *)p_Var1[5]._M_nxt;
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 8;
    }
    this = (deque<absl::time_internal::cctz::time_zone::Impl_const*,std::allocator<absl::time_internal::cctz::time_zone::Impl_const*>>
            *)ClearTimeZoneMapTestOnly::cleared;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_absl::time_internal::cctz::time_zone::Impl_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((anonymous_namespace)::time_zone_map_abi_cxx11_);
LAB_001529f7:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void time_zone::Impl::ClearTimeZoneMapTestOnly() {
  std::lock_guard<std::mutex> lock(TimeZoneMutex());
  if (time_zone_map != nullptr) {
    // Existing time_zone::Impl* entries are in the wild, so we can't delete
    // them. Instead, we move them to a private container, where they are
    // logically unreachable but not "leaked".  Future requests will result
    // in reloading the data.
    static auto* cleared = new std::deque<const time_zone::Impl*>;
    for (const auto& element : *time_zone_map) {
      cleared->push_back(element.second);
    }
    time_zone_map->clear();
  }
}